

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

void __thiscall
llm_build_bailingmoe::llm_build_bailingmoe
          (llm_build_bailingmoe *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  llama_memory_i *plVar1;
  llama_hparams *plVar2;
  ggml_tensor *pgVar3;
  undefined8 uVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  pointer plVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ggml_tensor *cur;
  ggml_tensor *cur_00;
  int il;
  long lVar10;
  long lVar11;
  float fVar12;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar13;
  ggml_tensor *local_68;
  int local_50;
  undefined4 local_4c;
  ggml_cgraph *local_48;
  ggml_tensor *local_40;
  llm_graph_input_attn_kv_unified *local_38;
  
  local_48 = gf;
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  local_68 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  local_40 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  local_38 = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  if (0 < (this->super_llm_graph_context).n_layer) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      uVar13 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      il = (int)lVar10;
      pgVar3 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_68,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->attn_norm + lVar11),
                          (ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar3,"attn_norm",il);
      plVar1 = (this->super_llm_graph_context).memory;
      local_4c = (undefined4)(this->super_llm_graph_context).n_ctx_per_seq;
      local_50 = il;
      if (plVar1[10]._vptr_llama_memory_i == (_func_int **)0x0) {
        std::__throw_bad_function_call();
      }
      uVar4 = (*(code *)plVar1[0xb]._vptr_llama_memory_i)(plVar1 + 8,&local_4c,&local_50);
      pgVar5 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->wq + lVar11),pgVar3);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Qcur",il);
      plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (*(long *)((long)&plVar7->bq + lVar11) != 0) {
        pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"Qcur",il);
        plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      pgVar6 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)((long)&plVar7->wk + lVar11),pgVar3);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Kcur",il);
      plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (*(long *)((long)&plVar7->bk + lVar11) != 0) {
        pgVar6 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Kcur",il);
        plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      pgVar3 = llm_graph_context::build_lora_mm
                         (&this->super_llm_graph_context,
                          *(ggml_tensor **)((long)&plVar7->wv + lVar11),pgVar3);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar3,"Vcur",il);
      if (*(long *)((long)&((model->layers).
                            super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                            super__Vector_impl_data._M_start)->bv + lVar11) != 0) {
        pgVar3 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar3);
        llm_graph_context::cb(&this->super_llm_graph_context,pgVar3,"Vcur",il);
      }
      uVar8 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar5,
                              (this->super_llm_graph_context).n_rot,
                              (this->super_llm_graph_context).n_head,
                              (long)(this->super_llm_graph_context).n_tokens);
      uVar9 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar6,
                              (this->super_llm_graph_context).n_rot,
                              (this->super_llm_graph_context).n_head_kv,
                              (long)(this->super_llm_graph_context).n_tokens);
      pgVar6 = (ggml_tensor *)
               ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar3,
                               (this->super_llm_graph_context).n_rot,
                               (this->super_llm_graph_context).n_head_kv,
                               (long)(this->super_llm_graph_context).n_tokens);
      cur = (ggml_tensor *)
            ggml_rope_ext((this->super_llm_graph_context).freq_base,
                          (this->super_llm_graph_context).freq_scale,
                          (this->super_llm_graph_context).ext_factor,
                          (this->super_llm_graph_context).attn_factor,
                          (this->super_llm_graph_context).beta_fast,
                          (this->super_llm_graph_context).beta_slow,
                          (this->super_llm_graph_context).ctx0,uVar8,local_40,uVar4,
                          (int)(this->super_llm_graph_context).n_rot,
                          (this->super_llm_graph_context).rope_type,
                          CONCAT44(uVar13,(this->super_llm_graph_context).n_ctx_orig));
      cur_00 = (ggml_tensor *)
               ggml_rope_ext((this->super_llm_graph_context).freq_base,
                             (this->super_llm_graph_context).freq_scale,
                             (this->super_llm_graph_context).ext_factor,
                             (this->super_llm_graph_context).attn_factor,
                             (this->super_llm_graph_context).beta_fast,
                             (this->super_llm_graph_context).beta_slow,
                             (this->super_llm_graph_context).ctx0,uVar9,local_40,uVar4,
                             (int)(this->super_llm_graph_context).n_rot,
                             (this->super_llm_graph_context).rope_type,
                             (this->super_llm_graph_context).n_ctx_orig);
      llm_graph_context::cb(&this->super_llm_graph_context,cur,"Qcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,cur_00,"Kcur",il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"Vcur",il);
      plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      fVar12 = (float)(this->super_llm_graph_context).n_rot;
      pgVar3 = *(ggml_tensor **)((long)&plVar7->wo + lVar11);
      pgVar5 = *(ggml_tensor **)((long)&plVar7->bo + lVar11);
      if (fVar12 < 0.0) {
        fVar12 = sqrtf(fVar12);
      }
      else {
        fVar12 = SQRT(fVar12);
      }
      pgVar3 = llm_graph_context::build_attn
                         (&this->super_llm_graph_context,local_38,local_48,pgVar3,pgVar5,cur,cur_00,
                          pgVar6,(ggml_tensor *)0x0,(ggml_tensor *)0x0,1.0 / fVar12,il);
      if (lVar10 == (this->super_llm_graph_context).n_layer + -1) {
        pgVar5 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
        pgVar3 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar3,pgVar5);
        local_68 = (ggml_tensor *)
                   ggml_get_rows((this->super_llm_graph_context).ctx0,local_68,pgVar5);
      }
      pgVar3 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar3,local_68);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar3,"ffn_inp",il);
      pgVar5 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,pgVar3,
                          *(ggml_tensor **)
                           ((long)&((model->layers).
                                    super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ffn_norm + lVar11),
                          (ggml_tensor *)0x0,LLM_NORM_RMS,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_norm",il);
      plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      plVar2 = (this->super_llm_graph_context).hparams;
      pgVar6 = llm_graph_context::build_moe_ffn
                         (&this->super_llm_graph_context,pgVar5,
                          *(ggml_tensor **)((long)&plVar7->ffn_gate_inp + lVar11),
                          *(ggml_tensor **)((long)&plVar7->ffn_up_exps + lVar11),
                          *(ggml_tensor **)((long)&plVar7->ffn_gate_exps + lVar11),
                          *(ggml_tensor **)((long)&plVar7->ffn_down_exps + lVar11),
                          (ggml_tensor *)0x0,(this->super_llm_graph_context).n_expert,
                          (this->super_llm_graph_context).n_expert_used,LLM_FFN_SILU,
                          plVar2->expert_weights_norm,false,plVar2->expert_weights_scale,
                          LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"ffn_moe_out",il);
      plVar7 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      in_stack_ffffffffffffff48 = 0;
      pgVar5 = llm_graph_context::build_ffn
                         (&this->super_llm_graph_context,pgVar5,
                          *(ggml_tensor **)((long)&plVar7->ffn_up_shexp + lVar11),(ggml_tensor *)0x0
                          ,(ggml_tensor *)0x0,
                          *(ggml_tensor **)((long)&plVar7->ffn_gate_shexp + lVar11),
                          (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                          *(ggml_tensor **)((long)&plVar7->ffn_down_shexp + lVar11),
                          (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_SILU,
                          LLM_FFN_PAR,il);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_shexp",il);
      pgVar5 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar6,pgVar5);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar5,"ffn_out",il);
      pgVar3 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar5,pgVar3);
      local_68 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar3,il);
      llm_graph_context::cb(&this->super_llm_graph_context,local_68,"l_out",il);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x4f0;
    } while (lVar10 < (this->super_llm_graph_context).n_layer);
  }
  pgVar3 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,local_68,model->output_norm,(ggml_tensor *)0x0,
                      LLM_NORM_RMS,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar3,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar3;
  pgVar3 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar3);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar3,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar3;
  ggml_build_forward_expand(local_48,pgVar3);
  return;
}

Assistant:

llm_build_bailingmoe(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // rope freq factors for llama3; may return nullptr for llama2 and other models
                ggml_tensor * rope_factors = static_cast<const llama_kv_cache_unified *>(memory)->cbs.get_rope_factors(n_ctx_per_seq, il);

                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_rot, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_rot, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_rot, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, rope_factors,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_rot)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            ggml_tensor * moe_out =
                build_moe_ffn(cur,
                        model.layers[il].ffn_gate_inp,
                        model.layers[il].ffn_up_exps,
                        model.layers[il].ffn_gate_exps,
                        model.layers[il].ffn_down_exps,
                        nullptr,
                        n_expert, n_expert_used,
                        LLM_FFN_SILU, hparams.expert_weights_norm,
                        false, hparams.expert_weights_scale,
                        LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                        il);
            cb(moe_out, "ffn_moe_out", il);

            // FFN shared expert
            {
                ggml_tensor * ffn_shexp = build_ffn(cur,
                        model.layers[il].ffn_up_shexp,   NULL, NULL,
                        model.layers[il].ffn_gate_shexp, NULL, NULL,
                        model.layers[il].ffn_down_shexp, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(ffn_shexp, "ffn_shexp", il);

                cur = ggml_add(ctx0, moe_out, ffn_shexp);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }